

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double anglit_pdf(double x)

{
  double dVar1;
  
  if (ABS(x) < 0.7853981633974483) {
    dVar1 = sin(x + x + 0.7853981633974483);
    return dVar1;
  }
  return 0.0;
}

Assistant:

double anglit_pdf ( double x )

//****************************************************************************80
//
//  Purpose:
//
//    ANGLIT_PDF evaluates the Anglit PDF.
//
//  Formula:
//
//    PDF(X) = SIN ( 2 * X + PI / 2 ) for -PI/4 <= X <= PI/4
//
//  Modified:
//
//    28 December 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Output, double ANGLIT_PDF, the value of the PDF.
//
{
  double pdf;
  const double r8_pi = 3.14159265358979323;

  if ( x <= - 0.25 * r8_pi || 0.25 * r8_pi <= x )
  {
    pdf = 0.0;
  }
  else
  {
    pdf = sin ( 2.0 * x + 0.25 * r8_pi );
  }

  return pdf;
}